

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuddAndAbs.c
# Opt level: O0

DdNode * cuddBddAndAbstractRecur(DdManager *manager,DdNode *f,DdNode *g,DdNode *cube)

{
  uint uVar1;
  uint uVar2;
  DdManager *pDVar3;
  uint *puVar4;
  uint *puVar5;
  DdNode *pDVar6;
  abctime aVar7;
  DdManager *n;
  DdNode *E;
  DdNode *pDVar8;
  uint local_b4;
  DdNode *Cube;
  DdNode *tmp;
  uint index;
  uint top;
  uint topcube;
  uint topg;
  uint topf;
  DdNode *e;
  DdNode *t;
  DdNode *r;
  DdNode *zero;
  DdNode *one;
  DdNode *ge;
  DdNode *gt;
  DdNode *G;
  DdNode *fe;
  DdNode *ft;
  DdNode *F;
  DdNode *cube_local;
  DdNode *g_local;
  DdNode *f_local;
  DdManager *manager_local;
  
  pDVar3 = (DdManager *)manager->one;
  manager_local = (DdManager *)((ulong)pDVar3 ^ 1);
  if (((((DdManager *)f != manager_local) && ((DdManager *)g != manager_local)) &&
      (f != (DdNode *)((ulong)g ^ 1))) &&
     (((DdManager *)f != pDVar3 || (manager_local = pDVar3, (DdManager *)g != pDVar3)))) {
    if ((DdManager *)cube == pDVar3) {
      manager_local = (DdManager *)cuddBddAndRecur(manager,f,g);
    }
    else if (((DdManager *)f == pDVar3) || (f == g)) {
      manager_local = (DdManager *)cuddBddExistAbstractRecur(manager,g,cube);
    }
    else if ((DdManager *)g == pDVar3) {
      manager_local = (DdManager *)cuddBddExistAbstractRecur(manager,f,cube);
    }
    else {
      cube_local = g;
      g_local = f;
      if (g < f) {
        cube_local = f;
        g_local = g;
      }
      puVar4 = (uint *)((ulong)g_local & 0xfffffffffffffffe);
      puVar5 = (uint *)((ulong)cube_local & 0xfffffffffffffffe);
      uVar1 = manager->perm[*puVar4];
      uVar2 = manager->perm[*puVar5];
      local_b4 = uVar1;
      if (uVar2 < uVar1) {
        local_b4 = uVar2;
      }
      index = manager->perm[cube->index];
      F = cube;
      while (index < local_b4) {
        F = (F->type).kids.T;
        if ((DdManager *)F == pDVar3) {
          pDVar6 = cuddBddAndRecur(manager,g_local,cube_local);
          return pDVar6;
        }
        index = manager->perm[(((DdManager *)F)->sentinel).index];
      }
      if (((puVar4[1] == 1) && (puVar5[1] == 1)) ||
         (manager_local = (DdManager *)cuddCacheLookup(manager,6,g_local,cube_local,F),
         manager_local == (DdManager *)0x0)) {
        if ((manager->TimeStop == 0) || (aVar7 = Abc_Clock(), aVar7 <= manager->TimeStop)) {
          if (uVar1 == local_b4) {
            tmp._4_4_ = *puVar4;
            fe = *(DdNode **)(puVar4 + 4);
            G = *(DdNode **)(puVar4 + 6);
            if (((ulong)g_local & 1) != 0) {
              fe = (DdNode *)((ulong)fe ^ 1);
              G = (DdNode *)((ulong)G ^ 1);
            }
          }
          else {
            tmp._4_4_ = *puVar5;
            G = g_local;
            fe = g_local;
          }
          if (uVar2 == local_b4) {
            ge = *(DdNode **)(puVar5 + 4);
            one = *(DdNode **)(puVar5 + 6);
            if (((ulong)cube_local & 1) != 0) {
              ge = (DdNode *)((ulong)ge ^ 1);
              one = (DdNode *)((ulong)one ^ 1);
            }
          }
          else {
            one = cube_local;
            ge = cube_local;
          }
          if (index == local_b4) {
            pDVar6 = (F->type).kids.T;
            n = (DdManager *)cuddBddAndAbstractRecur(manager,fe,ge,pDVar6);
            if (n == (DdManager *)0x0) {
              return (DdNode *)0x0;
            }
            if (((n == pDVar3) || (n == (DdManager *)G)) || (n == (DdManager *)one)) {
              if ((puVar4[1] == 1) && (puVar5[1] == 1)) {
                return &n->sentinel;
              }
              cuddCacheInsert(manager,6,g_local,cube_local,F,(DdNode *)n);
              return &n->sentinel;
            }
            *(int *)(((ulong)n & 0xfffffffffffffffe) + 4) =
                 *(int *)(((ulong)n & 0xfffffffffffffffe) + 4) + 1;
            if (n == (DdManager *)((ulong)G ^ 1)) {
              _topg = (DdManager *)cuddBddExistAbstractRecur(manager,one,pDVar6);
            }
            else if (n == (DdManager *)((ulong)one ^ 1)) {
              _topg = (DdManager *)cuddBddExistAbstractRecur(manager,G,pDVar6);
            }
            else {
              _topg = (DdManager *)cuddBddAndAbstractRecur(manager,G,one,pDVar6);
            }
            if (_topg == (DdManager *)0x0) {
              Cudd_IterDerefBdd(manager,(DdNode *)n);
              return (DdNode *)0x0;
            }
            if (n == _topg) {
              *(int *)(((ulong)n & 0xfffffffffffffffe) + 4) =
                   *(int *)(((ulong)n & 0xfffffffffffffffe) + 4) + -1;
              t = (DdNode *)n;
            }
            else {
              *(int *)(((ulong)_topg & 0xfffffffffffffffe) + 4) =
                   *(int *)(((ulong)_topg & 0xfffffffffffffffe) + 4) + 1;
              pDVar6 = cuddBddAndRecur(manager,(DdNode *)((ulong)n ^ 1),(DdNode *)((ulong)_topg ^ 1)
                                      );
              if (pDVar6 == (DdNode *)0x0) {
                Cudd_IterDerefBdd(manager,(DdNode *)n);
                Cudd_IterDerefBdd(manager,&_topg->sentinel);
                return (DdNode *)0x0;
              }
              t = (DdNode *)((ulong)pDVar6 ^ 1);
              *(int *)(((ulong)t & 0xfffffffffffffffe) + 4) =
                   *(int *)(((ulong)t & 0xfffffffffffffffe) + 4) + 1;
              Cudd_DelayedDerefBdd(manager,(DdNode *)n);
              Cudd_DelayedDerefBdd(manager,&_topg->sentinel);
              *(int *)(((ulong)t & 0xfffffffffffffffe) + 4) =
                   *(int *)(((ulong)t & 0xfffffffffffffffe) + 4) + -1;
            }
          }
          else {
            pDVar6 = cuddBddAndAbstractRecur(manager,fe,ge,F);
            if (pDVar6 == (DdNode *)0x0) {
              return (DdNode *)0x0;
            }
            *(int *)(((ulong)pDVar6 & 0xfffffffffffffffe) + 4) =
                 *(int *)(((ulong)pDVar6 & 0xfffffffffffffffe) + 4) + 1;
            E = cuddBddAndAbstractRecur(manager,G,one,F);
            if (E == (DdNode *)0x0) {
              Cudd_IterDerefBdd(manager,pDVar6);
              return (DdNode *)0x0;
            }
            if (pDVar6 == E) {
              *(int *)(((ulong)pDVar6 & 0xfffffffffffffffe) + 4) =
                   *(int *)(((ulong)pDVar6 & 0xfffffffffffffffe) + 4) + -1;
              t = pDVar6;
            }
            else {
              *(int *)(((ulong)E & 0xfffffffffffffffe) + 4) =
                   *(int *)(((ulong)E & 0xfffffffffffffffe) + 4) + 1;
              if (((ulong)pDVar6 & 1) == 0) {
                t = cuddUniqueInter(manager,tmp._4_4_,pDVar6,E);
                if (t == (DdNode *)0x0) {
                  Cudd_IterDerefBdd(manager,pDVar6);
                  Cudd_IterDerefBdd(manager,E);
                  return (DdNode *)0x0;
                }
              }
              else {
                pDVar8 = cuddUniqueInter(manager,tmp._4_4_,(DdNode *)((ulong)pDVar6 ^ 1),
                                         (DdNode *)((ulong)E ^ 1));
                if (pDVar8 == (DdNode *)0x0) {
                  Cudd_IterDerefBdd(manager,pDVar6);
                  Cudd_IterDerefBdd(manager,E);
                  return (DdNode *)0x0;
                }
                t = (DdNode *)((ulong)pDVar8 ^ 1);
              }
              *(int *)(((ulong)E & 0xfffffffffffffffe) + 4) =
                   *(int *)(((ulong)E & 0xfffffffffffffffe) + 4) + -1;
              *(int *)(((ulong)pDVar6 & 0xfffffffffffffffe) + 4) =
                   *(int *)(((ulong)pDVar6 & 0xfffffffffffffffe) + 4) + -1;
            }
          }
          if ((puVar4[1] != 1) || (puVar5[1] != 1)) {
            cuddCacheInsert(manager,6,g_local,cube_local,F,t);
          }
          manager_local = (DdManager *)t;
        }
        else {
          manager_local = (DdManager *)0x0;
        }
      }
    }
  }
  return &manager_local->sentinel;
}

Assistant:

DdNode *
cuddBddAndAbstractRecur(
  DdManager * manager,
  DdNode * f,
  DdNode * g,
  DdNode * cube)
{
    DdNode *F, *ft, *fe, *G, *gt, *ge;
    DdNode *one, *zero, *r, *t, *e;
    unsigned int topf, topg, topcube, top, index;

    statLine(manager);
    one = DD_ONE(manager);
    zero = Cudd_Not(one);

    /* Terminal cases. */
    if (f == zero || g == zero || f == Cudd_Not(g)) return(zero);
    if (f == one && g == one)   return(one);

    if (cube == one) {
        return(cuddBddAndRecur(manager, f, g));
    }
    if (f == one || f == g) {
        return(cuddBddExistAbstractRecur(manager, g, cube));
    }
    if (g == one) {
        return(cuddBddExistAbstractRecur(manager, f, cube));
    }
    /* At this point f, g, and cube are not constant. */

    if (f > g) { /* Try to increase cache efficiency. */
        DdNode *tmp = f;
        f = g;
        g = tmp;
    }

    /* Here we can skip the use of cuddI, because the operands are known
    ** to be non-constant.
    */
    F = Cudd_Regular(f);
    G = Cudd_Regular(g);
    topf = manager->perm[F->index];
    topg = manager->perm[G->index];
    top = ddMin(topf, topg);
    topcube = manager->perm[cube->index];

    while (topcube < top) {
        cube = cuddT(cube);
        if (cube == one) {
            return(cuddBddAndRecur(manager, f, g));
        }
        topcube = manager->perm[cube->index];
    }
    /* Now, topcube >= top. */

    /* Check cache. */
    if (F->ref != 1 || G->ref != 1) {
        r = cuddCacheLookup(manager, DD_BDD_AND_ABSTRACT_TAG, f, g, cube);
        if (r != NULL) {
            return(r);
        }
    }

    if ( manager->TimeStop && Abc_Clock() > manager->TimeStop )
        return NULL;

    if (topf == top) {
        index = F->index;
        ft = cuddT(F);
        fe = cuddE(F);
        if (Cudd_IsComplement(f)) {
            ft = Cudd_Not(ft);
            fe = Cudd_Not(fe);
        }
    } else {
        index = G->index;
        ft = fe = f;
    }

    if (topg == top) {
        gt = cuddT(G);
        ge = cuddE(G);
        if (Cudd_IsComplement(g)) {
            gt = Cudd_Not(gt);
            ge = Cudd_Not(ge);
        }
    } else {
        gt = ge = g;
    }

    if (topcube == top) {       /* quantify */
        DdNode *Cube = cuddT(cube);
        t = cuddBddAndAbstractRecur(manager, ft, gt, Cube);
        if (t == NULL) return(NULL);
        /* Special case: 1 OR anything = 1. Hence, no need to compute
        ** the else branch if t is 1. Likewise t + t * anything == t.
        ** Notice that t == fe implies that fe does not depend on the
        ** variables in Cube. Likewise for t == ge.
        */
        if (t == one || t == fe || t == ge) {
            if (F->ref != 1 || G->ref != 1)
                cuddCacheInsert(manager, DD_BDD_AND_ABSTRACT_TAG,
                                f, g, cube, t);
            return(t);
        }
        cuddRef(t);
        /* Special case: t + !t * anything == t + anything. */
        if (t == Cudd_Not(fe)) {
            e = cuddBddExistAbstractRecur(manager, ge, Cube);
        } else if (t == Cudd_Not(ge)) {
            e = cuddBddExistAbstractRecur(manager, fe, Cube);
        } else {
            e = cuddBddAndAbstractRecur(manager, fe, ge, Cube);
        }
        if (e == NULL) {
            Cudd_IterDerefBdd(manager, t);
            return(NULL);
        }
        if (t == e) {
            r = t;
            cuddDeref(t);
        } else {
            cuddRef(e);
            r = cuddBddAndRecur(manager, Cudd_Not(t), Cudd_Not(e));
            if (r == NULL) {
                Cudd_IterDerefBdd(manager, t);
                Cudd_IterDerefBdd(manager, e);
                return(NULL);
            }
            r = Cudd_Not(r);
            cuddRef(r);
            Cudd_DelayedDerefBdd(manager, t);
            Cudd_DelayedDerefBdd(manager, e);
            cuddDeref(r);
        }
    } else {
        t = cuddBddAndAbstractRecur(manager, ft, gt, cube);
        if (t == NULL) return(NULL);
        cuddRef(t);
        e = cuddBddAndAbstractRecur(manager, fe, ge, cube);
        if (e == NULL) {
            Cudd_IterDerefBdd(manager, t);
            return(NULL);
        }
        if (t == e) {
            r = t;
            cuddDeref(t);
        } else {
            cuddRef(e);
            if (Cudd_IsComplement(t)) {
                r = cuddUniqueInter(manager, (int) index,
                                    Cudd_Not(t), Cudd_Not(e));
                if (r == NULL) {
                    Cudd_IterDerefBdd(manager, t);
                    Cudd_IterDerefBdd(manager, e);
                    return(NULL);
                }
                r = Cudd_Not(r);
            } else {
                r = cuddUniqueInter(manager,(int)index,t,e);
                if (r == NULL) {
                    Cudd_IterDerefBdd(manager, t);
                    Cudd_IterDerefBdd(manager, e);
                    return(NULL);
                }
            }
            cuddDeref(e);
            cuddDeref(t);
        }
    }

    if (F->ref != 1 || G->ref != 1)
        cuddCacheInsert(manager, DD_BDD_AND_ABSTRACT_TAG, f, g, cube, r);
    return (r);

}